

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::SkeletonReader::~SkeletonReader(SkeletonReader *this)

{
  ostream *poVar1;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__SkeletonReader_0081e5a0;
  if (this->m_Verbosity == 5) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Skeleton Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ReaderRank);
    poVar1 = std::operator<<(poVar1," deconstructor on ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->super_Engine).m_Name);
    std::operator<<(poVar1,"\n");
  }
  (this->super_Engine).m_IsOpen = false;
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

SkeletonReader::~SkeletonReader()
{
    /* m_Skeleton deconstructor does close and finalize */
    if (m_Verbosity == 5)
    {
        std::cout << "Skeleton Reader " << m_ReaderRank << " deconstructor on " << m_Name << "\n";
    }
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}